

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymProp::gen_code_call
          (CTcSymProp *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int in_ECX;
  int iVar4;
  undefined4 in_register_0000000c;
  int in_EDX;
  void *__buf;
  int in_ESI;
  CTcSymPropBase *in_RDI;
  int *in_R8;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  CTcCodeStream *in_stack_ffffffffffffffb8;
  CTcGenTarg *in_stack_ffffffffffffffc0;
  
  iVar4 = in_ECX;
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    sVar2 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d77c2);
    pcVar3 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d77d0);
    CTcTokenizer::log_error(0x2cf5,sVar2 & 0xffffffff,pcVar3);
  }
  else {
    iVar1 = CTcGenTarg::is_speculative(G_cg);
    if ((iVar1 != 0) && ((in_EDX != 0 || ((in_R8 != (int *)0x0 && (*in_R8 != 0)))))) {
      err_throw(0);
    }
    iVar1 = CTcGenTarg::is_speculative(G_cg);
    if (iVar1 == 0) {
      if (in_EDX == 0) {
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        in_stack_ffffffffffffffc0 = (CTcGenTarg *)G_cs;
        CTcSymPropBase::get_prop(in_RDI);
        CTcDataStream::write_prop_id
                  ((CTcDataStream *)in_stack_ffffffffffffffc0,
                   (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
      else {
        if (in_ECX != 0) {
          CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        }
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,(int)(char)in_EDX,__buf,
                   CONCAT44(in_register_0000000c,iVar4));
        in_stack_ffffffffffffffb8 = G_cs;
        CTcSymPropBase::get_prop(in_RDI);
        CTcDataStream::write_prop_id
                  ((CTcDataStream *)in_stack_ffffffffffffffc0,
                   (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        CTcGenTarg::note_pop(G_cg,in_EDX);
      }
    }
    else {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcSymPropBase::get_prop(in_RDI);
      CTcDataStream::write_prop_id
                ((CTcDataStream *)in_stack_ffffffffffffffc0,
                 (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      CTcGenTarg::note_push((CTcGenTarg *)0x2d7890);
      CTcGenTarg::note_pop((CTcGenTarg *)0x2d789f);
    }
    CTcGenTarg::post_call_cleanup
              (in_stack_ffffffffffffffc0,(CTcNamedArgs *)in_stack_ffffffffffffffb8);
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d79a3);
    }
  }
  return;
}

Assistant:

void CTcSymProp::gen_code_call(int discard, int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    /* 
     *   if there's no "self", we can't invoke a property without an
     *   explicit object reference 
     */
    if (!G_cs->is_self_available())
    {
        G_tok->log_error(TCERR_PROP_NEEDS_OBJ, (int)get_sym_len(), get_sym());
        return;
    }

    /* don't allow calling with arguments in speculative mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate code to invoke the property of "self" */
    if (G_cg->is_speculative())
    {
        /* push 'self', then get the property in data-only mode */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_GETPROPDATA);
        G_cs->write_prop_id(get_prop());

        /* we pushed 'self' then popped it again */
        G_cg->note_push();
        G_cg->note_pop();
    }
    else if (argc == 0)
    {
        /* use the instruction with no arguments */
        G_cg->write_op(OPC_GETPROPSELF);
        G_cs->write_prop_id(get_prop());
    }
    else
    {
        /* write the varargs modifier if appropriate */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* use the instruction with arguments */
        G_cg->write_op(OPC_CALLPROPSELF);
        G_cs->write((char)argc);
        G_cs->write_prop_id(get_prop());

        /* callpropself removes arguments */
        G_cg->note_pop(argc);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding, push the return value from R0 */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}